

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

QList<std::pair<QString,_QString>_> * __thiscall
QUrlQuery::queryItems
          (QList<std::pair<QString,_QString>_> *__return_storage_ptr__,QUrlQuery *this,
          ComponentFormattingOptions encoding)

{
  QUrlQueryPrivate *pQVar1;
  pair<QString,_QString> *input;
  long lVar2;
  long in_FS_OFFSET;
  QList<std::pair<QString,_QString>_> *result;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  pair<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QUrlQueryPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0024824d;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QString,_QString> *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if ((QFlagsStorage<QUrl::ComponentFormattingOption>)
           encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
           super_QFlagsStorage<QUrl::ComponentFormattingOption>.i ==
           (QFlagsStorage<QUrl::ComponentFormattingOption>)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0024824d;
    QArrayDataPointer<std::pair<QString,_QString>_>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(pQVar1->itemList).d);
  }
  else {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QString,_QString> *)0x0;
    input = (pQVar1->itemList).d.ptr;
    lVar2 = (pQVar1->itemList).d.size;
    QList<std::pair<QString,_QString>_>::reserve(__return_storage_ptr__,lVar2);
    for (lVar2 = lVar2 * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
      QUrlQueryPrivate::recodeToUser((QString *)&local_80,(this->d).d.ptr,&input->first,encoding);
      QUrlQueryPrivate::recodeToUser((QString *)&local_98,(this->d).d.ptr,&input->second,encoding);
      std::pair<QString,_QString>::pair<QString,_QString,_true>
                (&local_68,(QString *)&local_80,(QString *)&local_98);
      QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                ((QList<std::pair<QString,QString>> *)__return_storage_ptr__,&local_68);
      std::pair<QString,_QString>::~pair(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      input = input + 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0024824d:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<QString, QString> > QUrlQuery::queryItems(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QList<std::pair<QString, QString> >();
    if (idempotentRecodeToUser(encoding))
        return d->itemList;

    QList<std::pair<QString, QString> > result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();
    result.reserve(d->itemList.size());
    for ( ; it != end; ++it)
        result << std::make_pair(d->recodeToUser(it->first, encoding),
                                 d->recodeToUser(it->second, encoding));
    return result;
}